

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_cleanup(nk_font_atlas *atlas)

{
  nk_font_config *pnVar1;
  nk_font_config *next;
  nk_font_config *iter;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bb9,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bba,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bbb,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bbc,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bbd,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((((atlas != (nk_font_atlas *)0x0) && ((atlas->permanent).alloc != (nk_plugin_alloc)0x0)) &&
      ((atlas->permanent).free != (nk_plugin_free)0x0)) && (atlas->config != (nk_font_config *)0x0))
  {
    next = atlas->config;
    while (next != (nk_font_config *)0x0) {
      pnVar1 = next->next;
      (*(atlas->permanent).free)((atlas->permanent).userdata,next->ttf_blob);
      (*(atlas->permanent).free)((atlas->permanent).userdata,next);
      next = pnVar1;
    }
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_cleanup(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;
    if (atlas->config) {
        struct nk_font_config *iter, *next;
        for (iter = atlas->config; iter; iter = next) {
            next = iter->next;
            atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
    }
}